

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O0

void __thiscall
xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::~Graph
          (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *this)

{
  bool bVar1;
  reference ppVar2;
  Vertex *in_RDI;
  pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>
  *vertex_pair;
  iterator __end0;
  iterator __begin0;
  VertexMapType *__range2;
  unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
  *in_stack_ffffffffffffffc8;
  Vertex *pVVar3;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_20;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_18;
  int64_t *local_10;
  
  local_10 = &(in_RDI->state).idx.y;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false,_false>
             ::operator*((_Node_iterator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false,_false>
                          *)0x102549);
    pVVar3 = ppVar2->second;
    if (pVVar3 != (Vertex *)0x0) {
      Vertex::~Vertex(in_RDI);
      operator_delete(pVVar3);
    }
    std::__detail::
    _Node_iterator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false,_false>
                  *)in_RDI);
  }
  std::
  unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
  ::~unordered_map((unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
                    *)0x10258f);
  return;
}

Assistant:

Graph<State, Transition, StateIndexer>::~Graph() {
  for (auto &vertex_pair : vertex_map_) {
    delete vertex_pair.second;
  }
}